

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

int slang::syntax::SyntaxFacts::getPrecedence(SyntaxKind kind)

{
  ulong uVar1;
  
  uVar1 = (ulong)(kind - ThroughoutSequenceExpr);
  if (kind - ThroughoutSequenceExpr < 0x32) {
    if ((0x7dfc000000U >> (uVar1 & 0x3f) & 1) != 0) {
      return 0xe;
    }
    if ((0x3000000000000U >> (uVar1 & 0x3f) & 1) != 0) {
      return 2;
    }
    if (uVar1 == 0) {
      return 8;
    }
  }
  switch(kind) {
  case IntersectSequenceExpr:
    return 6;
  case InvocationExpression:
  case JumpStatement:
  case LetDeclaration:
  case LibraryDeclaration:
  case LibraryIncDirClause:
  case LibraryIncludeStatement:
  case LibraryMap:
  case LineDirective:
  case LocalScope:
  case LocalVariableDeclaration:
  case LogicType:
switchD_0018e2eb_caseD_f4:
    return 0;
  case LessThanEqualExpression:
  case LessThanExpression:
LAB_0018e325:
    return 9;
  case LogicalAndExpression:
    return 4;
  case LogicalEquivalenceExpression:
  case LogicalImplicationExpression:
LAB_0018e325:
    return 2;
  case LogicalLeftShiftAssignmentExpression:
  case LogicalRightShiftAssignmentExpression:
switchD_0018e2eb_caseD_f3:
    return 1;
  case LogicalOrExpression:
    return 3;
  case LogicalShiftLeftExpression:
  case LogicalShiftRightExpression:
LAB_0018e325:
    return 10;
  }
  switch(kind) {
  case AddAssignmentExpression:
  case AndAssignmentExpression:
  case ArithmeticLeftShiftAssignmentExpression:
  case ArithmeticRightShiftAssignmentExpression:
    goto switchD_0018e2eb_caseD_f3;
  case AddExpression:
    return 0xb;
  case AlwaysBlock:
  case AlwaysCombBlock:
  case AlwaysFFBlock:
  case AlwaysLatchBlock:
  case AnonymousProgram:
  case AnsiPortList:
  case AnsiUdpPortList:
  case ArgumentList:
    goto switchD_0018e2eb_caseD_f4;
  case AndPropertyExpr:
  case AndSequenceExpr:
    return 5;
  case ArithmeticShiftLeftExpression:
  case ArithmeticShiftRightExpression:
    goto LAB_0018e325;
  default:
    uVar1 = (ulong)(kind - ModAssignmentExpression);
    if (kind - ModAssignmentExpression < 0x29) {
      if ((0x4200002001U >> (uVar1 & 0x3f) & 1) != 0) {
        return 1;
      }
      if ((0x4002UL >> (uVar1 & 0x3f) & 1) != 0) {
        return 0xc;
      }
      if ((0x18000000000U >> (uVar1 & 0x3f) & 1) != 0) {
        return 4;
      }
    }
    switch(kind) {
    case ImplicationPropertyExpr:
      goto switchD_0018e2eb_caseD_f3;
    case ImplicitAnsiPort:
    case ImplicitEventControl:
    case ImplicitNonAnsiPort:
    case ImplicitType:
    case IncludeDirective:
    case InitialBlock:
      goto switchD_0018e2eb_caseD_f4;
    case ImpliesPropertyExpr:
      goto LAB_0018e325;
    case InequalityExpression:
      return 8;
    case InsideExpression:
      goto LAB_0018e325;
    default:
      if (kind - BinaryXnorExpression < 2) {
        return 6;
      }
      if (kind - GreaterThanEqualExpression < 2) {
        return 9;
      }
      if (kind - SUntilPropertyExpr < 2) {
        return 2;
      }
      if (kind - WildcardEqualityExpression < 2) {
        return 8;
      }
      if (kind == AssignmentExpression) {
        return 1;
      }
      if (kind == BinaryAndExpression) {
        return 7;
      }
      if (kind == BinaryOrExpression) {
        return 5;
      }
      if (kind == CaseEqualityExpression) {
        return 8;
      }
      if (kind == CaseInequalityExpression) {
        return 8;
      }
      if (kind == DivideAssignmentExpression) {
        return 1;
      }
      if (kind == DivideExpression) {
        return 0xc;
      }
      if (kind == EqualityExpression) {
        return 8;
      }
      if (kind == ExpressionOrDist) {
        return 9;
      }
      if (kind == FollowedByPropertyExpr) {
        return 1;
      }
      if (kind == IffPropertyExpr) {
        return 3;
      }
      if (kind != PowerExpression) {
        if (kind == SubtractAssignmentExpression) {
          return 1;
        }
        if (kind == SubtractExpression) {
          return 0xb;
        }
        if (kind == WithinSequenceExpr) {
          return 7;
        }
        if (kind == XorAssignmentExpression) {
          return 1;
        }
        return 0;
      }
      return 0xd;
    }
  }
}

Assistant:

int SyntaxFacts::getPrecedence(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::XorAssignmentExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
        case SyntaxKind::ImplicationPropertyExpr:
        case SyntaxKind::FollowedByPropertyExpr:
            return 1;
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::UntilPropertyExpr:
        case SyntaxKind::SUntilPropertyExpr:
        case SyntaxKind::UntilWithPropertyExpr:
        case SyntaxKind::SUntilWithPropertyExpr:
        case SyntaxKind::ImpliesPropertyExpr:
            return 2;
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::IffPropertyExpr:
            return 3;
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::OrPropertyExpr:
        case SyntaxKind::OrSequenceExpr:
            return 4;
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::AndPropertyExpr:
        case SyntaxKind::AndSequenceExpr:
            return 5;
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::IntersectSequenceExpr:
            return 6;
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::WithinSequenceExpr:
            return 7;
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::ThroughoutSequenceExpr:
            return 8;
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::InsideExpression:
        case SyntaxKind::ExpressionOrDist:
            return 9;
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
            return 10;
        case SyntaxKind::AddExpression:
        case SyntaxKind::SubtractExpression:
            return 11;
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::ModExpression:
            return 12;
        case SyntaxKind::PowerExpression:
            return 13;
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
        case SyntaxKind::UnaryLogicalNotExpression:
        case SyntaxKind::UnaryBitwiseNotExpression:
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            return 14;
        default:
            return 0;
    }
}